

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnmdec.c
# Opt level: O2

size_t ReadLine(uint8_t *data,size_t off,size_t data_size,char *out,size_t *out_size)

{
  uint8_t uVar1;
  ulong uVar2;
  ulong uVar3;
  
  *out_size = 0;
  uVar2 = 0;
LAB_00106b57:
  do {
    uVar3 = uVar2;
    if (off < data_size && uVar3 < 0x400) {
      uVar1 = data[off];
      off = off + 1;
      out[uVar3] = uVar1;
      if (uVar1 != '\n') {
        uVar2 = uVar3 + 1;
        goto LAB_00106b57;
      }
    }
    if ((data_size <= off) || ((uVar2 = 0, uVar3 != 0 && (uVar2 = 0, *out != '#')))) {
      out[uVar3] = '\0';
      *out_size = uVar3;
      return off;
    }
  } while( true );
}

Assistant:

static size_t ReadLine(const uint8_t* const data, size_t off, size_t data_size,
                       char out[MAX_LINE_SIZE + 1], size_t* const out_size) {
  size_t i = 0;
  *out_size = 0;
 redo:
  for (i = 0; i < MAX_LINE_SIZE && off < data_size; ++i) {
    out[i] = data[off++];
    if (out[i] == '\n') break;
  }
  if (off < data_size) {
    if (i == 0) goto redo;         // empty line
    if (out[0] == '#') goto redo;  // skip comment
  }
  out[i] = 0;   // safety sentinel
  *out_size = i;
  return off;
}